

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O3

Expression __thiscall
cnn::SimpleRNNBuilder::add_auxiliary_input(SimpleRNNBuilder *this,Expression *in,Expression *aux)

{
  ComputationGraph *pCVar1;
  undefined8 *puVar2;
  long lVar3;
  ComputationGraph *pCVar4;
  uint uVar5;
  undefined8 *in_RCX;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  Expression *pEVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  Expression EVar11;
  Expression y;
  ComputationGraph *local_e8;
  uint local_e0;
  initializer_list<cnn::expr::Expression> local_d8;
  Expression *local_c8;
  VariableIndex *local_c0;
  ulong local_b8;
  initializer_list<cnn::expr::Expression> local_b0;
  ComputationGraph local_a0;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  SimpleRNNBuilder *local_50;
  long local_48;
  long local_40;
  undefined8 *local_38;
  
  pCVar4 = in[6].pg;
  lVar6 = *(long *)&in[5].i;
  local_c8 = in;
  local_38 = in_RCX;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_a0,
             (ulong)in[8].i.t,(allocator_type *)&local_e8);
  local_c0 = &in[5].i;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)&in[5].i,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_a0);
  if ((ComputationGraph *)
      local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (ComputationGraph *)0x0) {
    operator_delete(local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  uVar8 = ((long)pCVar4 - lVar6 >> 3) * -0x5555555555555555;
  if (local_c8[8].i.t == 0) {
    lVar6 = *(long *)local_c0;
    local_b8 = uVar8 & 0xffffffff;
  }
  else {
    local_b8 = uVar8 & 0xffffffff;
    local_40 = local_b8 * 3;
    lVar7 = 8;
    lVar9 = 0;
    local_48 = (ulong)((int)uVar8 - 1) * 3;
    uVar8 = 0;
    pCVar4 = aux->pg;
    pEVar10 = local_c8;
    uVar5 = (aux->i).t;
    local_50 = this;
    do {
      pCVar1 = pEVar10[4].pg;
      puVar2 = *(undefined8 **)
                ((long)&(pCVar1->nodes).
                        super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar9);
      if ((ulong)(*(long *)((long)&(pCVar1->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + lVar9) - (long)puVar2
                 ) < 0x31) {
        __assert_fail("vars.size() >= L2H + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/rnn.cc"
                      ,0x62,
                      "Expression cnn::SimpleRNNBuilder::add_auxiliary_input(const Expression &, const Expression &)"
                     );
      }
      local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar2[4];
      local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(uint *)(puVar2 + 5);
      local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar2;
      local_a0.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(puVar2 + 1);
      local_a0.ee = (ExecutionEngine *)puVar2[6];
      local_68 = *(undefined4 *)(puVar2 + 7);
      local_60 = *local_38;
      local_58 = *(undefined4 *)(local_38 + 1);
      local_d8._M_len = 5;
      local_d8._M_array = (iterator)&local_a0;
      local_a0.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pCVar4;
      local_a0.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = uVar5;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_e8,&local_d8);
      pEVar10 = local_c8;
      if (local_b8 == 0) {
        pCVar4 = local_c8[7].pg;
        __x = extraout_XMM0_Qa;
        if (*(ComputationGraph **)&local_c8[7].i != pCVar4) {
          local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_e8;
          local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = local_e0;
          lVar6 = *(long *)((long)&(pCVar1->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar9);
          local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar6 + 0x10);
          local_a0.parameter_nodes.
          super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar6 + 0x18);
          local_a0.parameter_nodes.
          super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
          super__Vector_impl_data._M_finish = *(pointer *)((long)pCVar4 + lVar7 + -8);
          local_a0.parameter_nodes.
          super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               *(uint *)((long)&(pCVar4->nodes).
                                super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar7);
          local_b0._M_len = 3;
          local_b0._M_array = (iterator)&local_a0;
          expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&local_d8,&local_b0);
          __x = extraout_XMM0_Qa_01;
          goto LAB_0023e0db;
        }
      }
      else {
        local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e8;
        local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = local_e0;
        lVar6 = *(long *)((long)&(pCVar1->nodes).
                                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar9);
        local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar6 + 0x10);
        local_a0.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar6 + 0x18);
        lVar6 = *(long *)(*(long *)local_c0 + local_48 * 8);
        local_a0.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = *(pointer *)(lVar6 + -8 + lVar7);
        local_a0.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = *(uint *)(lVar6 + lVar7);
        local_b0._M_len = 3;
        local_b0._M_array = (iterator)&local_a0;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_d8,&local_b0);
        pEVar10 = local_c8;
        __x = extraout_XMM0_Qa_00;
LAB_0023e0db:
        local_e8 = (ComputationGraph *)local_d8._M_array;
        local_e0 = (uint)local_d8._M_len;
      }
      expr::tanh((expr *)&local_a0,__x);
      lVar6 = *(long *)&pEVar10[5].i;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x18;
      lVar3 = *(long *)(lVar6 + local_40 * 8);
      *(pointer *)(lVar3 + -8 + lVar7) =
           local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(uint *)(lVar3 + lVar7) =
           (uint)local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      lVar7 = lVar7 + 0x10;
      pCVar4 = (ComputationGraph *)
               local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      this = local_50;
      uVar5 = (uint)local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar8 < pEVar10[8].i.t);
  }
  lVar7 = *(long *)(lVar6 + 8 + local_b8 * 0x18);
  (this->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar7 + -0x10);
  (this->super_RNNBuilder).cur.t = *(int *)(lVar7 + -8);
  EVar11._8_8_ = lVar6;
  EVar11.pg = (ComputationGraph *)this;
  return EVar11;
}

Assistant:

Expression SimpleRNNBuilder::add_auxiliary_input(const Expression &in, const Expression &aux) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    assert(vars.size() >= L2H + 1);

    Expression y = affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux});

    if (t == 0 && h0.size() > 0)
      y = affine_transform({y, vars[H2H], h0[i]});
    else if (t >= 1)
      y = affine_transform({y, vars[H2H], h[t-1][i]});

    x = h[t][i] = tanh(y);
  }
  return h[t].back();
}